

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::ResetSimpleJitLimitAndCallCount(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  FunctionEntryPointInfo *pFVar3;
  FunctionEntryPointInfo *pFVar4;
  undefined4 *puVar5;
  FunctionBody *this_local;
  
  pFVar3 = GetDefaultFunctionEntryPointInfo(this);
  pFVar4 = GetSimpleJitEntryPointInfo(this);
  if (pFVar3 != pFVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b81,
                                "(GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo())"
                                ,
                                "GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  FunctionExecutionStateMachine::ResetSimpleJitLimit(&this->executionState);
  ResetSimpleJitCallCount(this);
  return;
}

Assistant:

void FunctionBody::ResetSimpleJitLimitAndCallCount()
    {
        Assert(GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo());

        executionState.ResetSimpleJitLimit();

        ResetSimpleJitCallCount();
    }